

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int sizeWords;
  string message;
  Graph g;
  ofstream myfile;
  ifstream infile;
  int local_474;
  char *local_470;
  undefined8 local_468;
  char local_460 [16];
  Graph local_450;
  char *local_438;
  undefined8 local_430;
  char local_428 [232];
  ios_base local_340 [264];
  istream local_238 [520];
  
  if (argc == 3) {
    std::ifstream::ifstream(local_238,argv[1],_S_in);
    local_470 = local_460;
    local_468 = 0;
    local_460[0] = '\0';
    std::operator>>(local_238,(string *)&local_470);
    std::istream::operator>>(local_238,&local_474);
    Graph::Graph(&local_450,(int)local_468);
    if (0 < local_474) {
      iVar1 = 0;
      do {
        local_430 = 0;
        local_428[0] = '\0';
        local_438 = local_428;
        std::operator>>(local_238,(string *)&local_438);
        Graph::rk(&local_450,local_438,local_470,0x65);
        if (local_438 != local_428) {
          operator_delete(local_438);
        }
        iVar1 = iVar1 + 1;
      } while (iVar1 < local_474);
    }
    std::ofstream::ofstream(&local_438);
    std::ofstream::open((char *)&local_438,(_Ios_Openmode)argv[2]);
    Graph::solve(&local_450);
    std::ostream::_M_insert<long_long>((longlong)&local_438);
    std::ofstream::close();
    local_438 = _VTT;
    *(undefined8 *)((long)&local_438 + *(long *)(_VTT + -0x18)) = ___cxa_atexit;
    std::filebuf::~filebuf((filebuf *)&local_430);
    std::ios_base::~ios_base(local_340);
    Graph::~Graph(&local_450);
    if (local_470 != local_460) {
      operator_delete(local_470);
    }
    std::ifstream::~ifstream(local_238);
    iVar1 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Run the code with the following command: ./project5 [input_file] [output_file]",0x4e
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc != 3) {
        cout << "Run the code with the following command: ./project5 [input_file] [output_file]" << endl;
        return 1;
    }
    ifstream infile(argv[1]);
    string message;
    infile >> message;
    int sizeWords ;
    infile >> sizeWords;
    Graph g(message.length());
    for (int i = 0; i < sizeWords; ++i) {
        string word;
        infile >> word;
        g.rk(word.c_str(),message.c_str(),101);
    }
    ofstream myfile;
    myfile.open(argv[2]);
    myfile << g.solve();
    myfile.close();
    return 0;
}